

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_example_json.h
# Opt level: O0

BaseState<true> * __thiscall
DefaultState<true>::Float(DefaultState<true> *this,Context<true> *ctx,float f)

{
  char *pcVar1;
  long in_RSI;
  BaseState<true> *in_RDI;
  Namespace<true> *ns;
  allocator *u;
  string *in_stack_ffffffffffffffa8;
  vw *in_stack_ffffffffffffffb0;
  feature_value in_stack_ffffffffffffffbc;
  Namespace<true> *in_stack_ffffffffffffffc0;
  
  Context<true>::CurrentNamespace((Context<true> *)0x2a6afa);
  pcVar1 = *(char **)(in_RSI + 0x10);
  u = (allocator *)&stack0xffffffffffffffbf;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&stack0xffffffffffffffc0,pcVar1,u);
  VW::hash_feature(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,(uint64_t)u);
  Namespace<true>::AddFeature
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,
             (feature_index)in_stack_ffffffffffffffb0,(char *)in_stack_ffffffffffffffa8);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffc0);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffbf);
  return in_RDI;
}

Assistant:

BaseState<audit>* Float(Context<audit>& ctx, float f)
  {
    auto& ns = ctx.CurrentNamespace();
    ns.AddFeature(f, VW::hash_feature(*ctx.all, ctx.key, ns.namespace_hash), ctx.key);

    return this;
  }